

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

MPP_RET hal_vp8e_enc_strm_code(void *hal,HalEncTask *task)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  RK_U8 *data;
  void *pvVar8;
  HalVp8ePicBuf *pic_buf;
  RK_U8 *p_start;
  RK_U32 bus_addr;
  RK_U32 buf_size;
  RK_U8 *p_end;
  Vp8eVpuBuf *buffers;
  RK_S32 offset;
  HalEncTask *enc_task;
  RK_U32 i;
  MppEncPrepCfg *prep;
  MppEncCfgSet *cfg;
  undefined4 local_60;
  VepuOffsetCfg hw_offset;
  Vp8eHwCfg *hw_cfg;
  HalVp8eCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  hw_offset.offset_pixel._4_8_ = (long)hal + 0x160;
  lVar1 = *(long *)((long)hal + 0x70);
  for (enc_task._4_4_ = 0; enc_task._4_4_ < 9; enc_task._4_4_ = enc_task._4_4_ + 1) {
    *(undefined8 *)((long)hal + (ulong)enc_task._4_4_ * 8 + 0x68a0) = 0;
    *(undefined4 *)((long)hal + (ulong)enc_task._4_4_ * 4 + 0x68e8) = 0;
  }
  cfg._4_4_ = *(undefined4 *)(lVar1 + 0x24);
  local_60 = *(undefined4 *)(lVar1 + 0xc);
  hw_offset.fmt = *(MppFrameFormat *)(lVar1 + 0x10);
  hw_offset.width = *(RK_U32 *)(lVar1 + 0x14);
  hw_offset.height = *(RK_U32 *)(lVar1 + 0x18);
  hw_offset.hor_stride = mpp_frame_get_offset_x(task->frame);
  hw_offset.ver_stride = mpp_frame_get_offset_y(task->frame);
  get_vepu_offset_cfg((VepuOffsetCfg *)((long)&cfg + 4));
  iVar5 = mpp_buffer_get_fd_with_caller(task->input,"hal_vp8e_enc_strm_code");
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x74) = iVar5;
  *(undefined4 *)(hw_offset.offset_pixel._4_8_ + 0x7c) =
       *(undefined4 *)(hw_offset.offset_pixel._4_8_ + 0x74);
  *(undefined4 *)(hw_offset.offset_pixel._4_8_ + 0x84) =
       *(undefined4 *)(hw_offset.offset_pixel._4_8_ + 0x7c);
  *(RK_U32 *)(hw_offset.offset_pixel._4_8_ + 0x78) = hw_offset.offset_x;
  *(RK_U32 *)(hw_offset.offset_pixel._4_8_ + 0x80) = hw_offset.offset_y;
  *(RK_U32 *)(hw_offset.offset_pixel._4_8_ + 0x88) = hw_offset.offset_byte[0];
  lVar1 = *(long *)((long)hal + 0x60);
  sVar7 = mpp_buffer_get_size_with_caller(*(MppBuffer *)(lVar1 + 0x58),"hal_vp8e_enc_strm_code");
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar1 + 0x58),"hal_vp8e_enc_strm_code");
  data = (RK_U8 *)mpp_buffer_get_ptr_with_caller
                            (*(MppBuffer *)(lVar1 + 0x58),"hal_vp8e_enc_strm_code");
  _bus_addr = data + 3;
  if (*(int *)((long)hal + 0x6924) == 0) {
    _bus_addr = data + 10;
  }
  iVar2 = (int)_bus_addr;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x37f8),data,iVar2 - (int)data);
  iVar6 = iVar2 - (int)data;
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x34) = iVar5;
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x38) = iVar6;
  iVar3 = (int)(RK_U8 *)((ulong)(_bus_addr + (sVar7 & 0xffffffff) / 10) & 0xfffffffffffffff8);
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x3820),_bus_addr,iVar3 - iVar2);
  iVar6 = iVar6 + (iVar3 - iVar2);
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x234) = iVar5;
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x254) = iVar6;
  pvVar8 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x58),"hal_vp8e_enc_strm_code");
  uVar4 = (int)pvVar8 + (int)sVar7 & 0xfffffff8;
  vp8e_set_buffer((Vp8ePutBitBuf *)((long)hal + 0x3848),
                  (RK_U8 *)((ulong)(_bus_addr + (sVar7 & 0xffffffff) / 10) & 0xfffffffffffffff8),
                  uVar4 - iVar3);
  *(int *)(hw_offset.offset_pixel._4_8_ + 0x238) = iVar5;
  *(uint *)(hw_offset.offset_pixel._4_8_ + 600) = iVar6 + (uVar4 - iVar3);
  *(uint *)(hw_offset.offset_pixel._4_8_ + 0x3c) = uVar4 - iVar3;
  *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x26) = 1;
  *(int *)(*(long *)((long)hal + 0x37e8) + 0x20) = (int)*(undefined8 *)((long)hal + 0x6918);
  *(bool *)(*(long *)((long)hal + 0x37e8) + 0x24) = *(int *)((long)hal + 0x6924) == 0;
  init_picbuf(hal);
  if (*(int *)((long)hal + 0x6924) == 1) {
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x25) = 1;
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x28) = 1;
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x29) = 1;
    *(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x27) = 1;
    *(undefined1 *)((long)hal + 0x376a) = 1;
    *(undefined1 *)((long)hal + 0x37a2) = 1;
    *(undefined1 *)((long)hal + 0x37da) = 1;
  }
  if (*(char *)(*(long *)((long)hal + 0x158) + 2) != '\0') {
    if ((*(int *)(*(long *)((long)hal + 0x158) + 0x5c) != 0) &&
       (*(undefined1 *)(*(long *)((long)hal + 0x37e8) + 0x29) = 1,
       *(char *)(*(long *)((long)hal + 0x37e8) + 0x28) == '\0')) {
      *(undefined1 *)((long)hal + 0x37a0) = 1;
    }
    set_frame_params(hal);
    set_picbuf_ref(hal);
    set_code_frame(hal);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp8e_enc_strm_code(void *hal, HalEncTask *task)
{
    HalVp8eCtx  *ctx  = (HalVp8eCtx *)hal;
    Vp8eHwCfg *hw_cfg = &ctx->hw_cfg;
    VepuOffsetCfg hw_offset;

    MppEncCfgSet  *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;

    {
        RK_U32 i = 0;
        for (i = 0; i < 9; i++) {
            ctx->p_out_buf[i] = NULL;
            ctx->stream_size[i] = 0;
        }
    }

    {
        hw_offset.fmt = prep->format;

        hw_offset.width = prep->width;
        hw_offset.height = prep->height;
        hw_offset.hor_stride = prep->hor_stride;
        hw_offset.ver_stride = prep->ver_stride;
        hw_offset.offset_x = mpp_frame_get_offset_x(task->frame);
        hw_offset.offset_y = mpp_frame_get_offset_y(task->frame);

        get_vepu_offset_cfg(&hw_offset);
    }

    {
        HalEncTask *enc_task = task;

        hw_cfg->input_lum_base = mpp_buffer_get_fd(enc_task->input);
        hw_cfg->input_cb_base  = hw_cfg->input_lum_base;
        hw_cfg->input_cr_base  = hw_cfg->input_cb_base;
        hw_cfg->input_lum_offset = hw_offset.offset_byte[0];
        hw_cfg->input_cb_offset = hw_offset.offset_byte[1];
        hw_cfg->input_cr_offset  = hw_offset.offset_byte[2];
    }

    // split memory for vp8 partition
    {
        RK_S32 offset = 0;
        Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
        RK_U8 *p_end = NULL;
        RK_U32 buf_size = mpp_buffer_get_size(buffers->hw_out_buf);
        RK_U32 bus_addr = mpp_buffer_get_fd(buffers->hw_out_buf);
        RK_U8 *p_start = mpp_buffer_get_ptr(buffers->hw_out_buf);

        p_end = p_start + 3;
        if (ctx->frame_type == VP8E_FRM_KEY)
            p_end += 7;// frame tag len:I frame 10 byte, P frmae 3 byte.
        vp8e_set_buffer(&ctx->bitbuf[0], p_start, p_end - p_start);

        offset = p_end - p_start;
        hw_cfg->output_strm_base = bus_addr;
        hw_cfg->output_strm_offset = offset;

        p_start = p_end;
        p_end = p_start + buf_size / 10;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[1], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[0] = bus_addr;
        hw_cfg->partition_offset[0] = offset;

        p_start = p_end;
        p_end = mpp_buffer_get_ptr(buffers->hw_out_buf) + buf_size;
        p_end = (RK_U8 *)((size_t)p_end & ~0x7);
        vp8e_set_buffer(&ctx->bitbuf[2], p_start, p_end - p_start);

        offset += p_end - p_start;
        hw_cfg->partition_Base[1] = bus_addr;
        hw_cfg->partition_offset[1] = offset;
        hw_cfg->output_strm_size = p_end - p_start;

        p_start = p_end;
    }

    {
        HalVp8ePicBuf *pic_buf = &ctx->picbuf;

        pic_buf->cur_pic->show = 1;
        pic_buf->cur_pic->poc = ctx->frame_cnt;
        pic_buf->cur_pic->i_frame = (ctx->frame_type == VP8E_FRM_KEY);

        init_picbuf(ctx);

        if (ctx->frame_type == VP8E_FRM_P) {
            pic_buf->cur_pic->p_frame = 1;
            pic_buf->cur_pic->arf = 1;
            pic_buf->cur_pic->grf = 1;
            pic_buf->cur_pic->ipf = 1;
            pic_buf->ref_pic_list[0].search = 1;
            pic_buf->ref_pic_list[1].search = 1;
            pic_buf->ref_pic_list[2].search = 1;
        }

        if (ctx->rc->frame_coded == 0)
            return MPP_OK;

        if (ctx->rc->golden_picture_rate) {
            pic_buf->cur_pic->grf = 1;
            if (!pic_buf->cur_pic->arf)
                pic_buf->ref_pic_list[1].arf = 1;
        }
    }
    set_frame_params(ctx);
    set_picbuf_ref(ctx);
    set_code_frame(ctx);

    return MPP_OK;
}